

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O2

HighsStatus __thiscall Highs::getKappa(Highs *this,double *kappa,bool exact,bool report)

{
  HighsStatus HVar1;
  double dVar2;
  allocator local_31;
  string local_30;
  
  if ((this->ekk_instance_).status_.has_invert == false) {
    std::__cxx11::string::string((string *)&local_30,"getBasisInverseRow",&local_31);
    HVar1 = invertRequirementError(this,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  else {
    dVar2 = HEkk::computeBasisCondition(&this->ekk_instance_,&(this->model_).lp_,exact,report);
    *kappa = dVar2;
    HVar1 = kOk;
  }
  return HVar1;
}

Assistant:

HighsStatus Highs::getKappa(double& kappa, const bool exact,
                            const bool report) const {
  if (!ekk_instance_.status_.has_invert)
    return invertRequirementError("getBasisInverseRow");
  kappa = ekk_instance_.computeBasisCondition(this->model_.lp_, exact, report);
  return HighsStatus::kOk;
}